

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  pointer pppuVar2;
  pointer pppuVar3;
  pointer pppuVar4;
  pointer pppuVar5;
  pointer pppuVar6;
  pointer pppuVar7;
  byte bVar8;
  uint j;
  long lVar9;
  size_t sVar10;
  size_t N_00;
  ulong uVar11;
  ulong uVar12;
  size_t N_01;
  ulong uVar13;
  ulong uVar14;
  uint j_1;
  uchar **ppuVar15;
  ulong uVar16;
  ulong uVar17;
  uchar **ppuVar18;
  size_t N_02;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_c8;
  vector_block<unsigned_char_*,_1024U> local_a0;
  vector_block<unsigned_char_*,_1024U> local_78;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_c8._left_in_block = 0;
  local_c8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._insertpos = (uchar **)0x0;
  local_c8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._insertpos = (uchar **)0x0;
  local_a0._left_in_block = 0;
  local_78._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._insertpos = (uchar **)0x0;
  local_78._left_in_block = 0;
  bVar8 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    ppuVar15 = strings;
    do {
      lVar9 = 0;
      do {
        if (ppuVar15[lVar9] == (uchar *)0x0) goto LAB_0021fa9a;
        abStack_50[lVar9] = ppuVar15[lVar9][depth];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      lVar9 = 0;
      ppuVar18 = ppuVar15;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_c8 +
                   (ulong)(abStack_50[lVar9] == bVar8) + (ulong)(bVar8 < abStack_50[lVar9]) * 2,
                   ppuVar18);
        lVar9 = lVar9 + 1;
        ppuVar18 = ppuVar18 + 1;
      } while (lVar9 != 0x20);
      uVar16 = uVar16 + 0x20;
      ppuVar15 = ppuVar15 + 0x20;
    } while (uVar16 < (N & 0xffffffffffffffe0));
  }
  lVar9 = N - uVar16;
  if (uVar16 <= N && lVar9 != 0) {
    ppuVar15 = strings + uVar16;
    do {
      if (*ppuVar15 == (uchar *)0x0) {
LAB_0021fa9a:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar1 = (*ppuVar15)[depth];
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_c8 + (ulong)(bVar1 == bVar8) + (ulong)(bVar8 < bVar1) * 2,ppuVar15);
      ppuVar15 = ppuVar15 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pppuVar7 = local_78._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar6 = local_78._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar5 = local_a0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar4 = local_a0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar3 = local_c8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar2 = local_c8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar16 = (long)local_c8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  N_00 = uVar16 * 0x80 - (ulong)local_c8._left_in_block;
  uVar11 = (long)local_a0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_a0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar14 = (ulong)local_a0._left_in_block;
  N_02 = uVar11 * 0x80 - uVar14;
  uVar12 = (long)local_78._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_78._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar13 = (ulong)local_78._left_in_block;
  N_01 = uVar12 * 0x80 - uVar13;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (uVar16 * 0x80 != (ulong)local_c8._left_in_block) {
    if (local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021fab9;
    ppuVar15 = strings;
    if (8 < uVar16) {
      uVar17 = 2;
      if (2 < (ulong)((long)uVar16 >> 3)) {
        uVar17 = (long)uVar16 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar15,pppuVar2[lVar9],0x2000);
        ppuVar15 = ppuVar15 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar17 - 1 != lVar9);
    }
    sVar10 = (long)local_c8._insertpos - (long)pppuVar3[-1];
    if (sVar10 != 0) {
      memmove(ppuVar15,pppuVar3[-1],sVar10);
    }
  }
  if (uVar11 * 0x80 != uVar14) {
    if (pppuVar4 == pppuVar5) goto LAB_0021fab9;
    ppuVar15 = strings + N_00;
    if (8 < uVar11) {
      uVar16 = 2;
      if (2 < (ulong)((long)uVar11 >> 3)) {
        uVar16 = (long)uVar11 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar15,pppuVar4[lVar9],0x2000);
        ppuVar15 = ppuVar15 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar16 - 1 != lVar9);
    }
    ppuVar18 = pppuVar5[-1];
    sVar10 = (long)local_a0._insertpos - (long)ppuVar18;
    if (sVar10 != 0) {
      memmove(ppuVar15,ppuVar18,sVar10);
    }
  }
  if (uVar12 * 0x80 != uVar13) {
    if (pppuVar6 == pppuVar7) {
LAB_0021fab9:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar15 = strings + N_00 + N_02;
    if (8 < uVar12) {
      uVar16 = 2;
      if (2 < (ulong)((long)uVar12 >> 3)) {
        uVar16 = (long)uVar12 >> 3;
      }
      lVar9 = 0;
      do {
        memmove(ppuVar15,pppuVar6[lVar9],0x2000);
        ppuVar15 = ppuVar15 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar16 - 1 != lVar9);
    }
    ppuVar18 = pppuVar7[-1];
    sVar10 = (long)local_78._insertpos - (long)ppuVar18;
    if (sVar10 != 0) {
      memmove(ppuVar15,ppuVar18,sVar10);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_c8);
  vector_block<unsigned_char_*,_1024U>::clear(&local_a0);
  vector_block<unsigned_char_*,_1024U>::clear(&local_78);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>(strings,N_00,depth);
  if (bVar8 != 0) {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
              (strings + N_00,N_02,depth + 1);
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
            (strings + N_00 + N_02,N_01,depth);
  lVar9 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_c8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}